

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O0

void __thiscall miniminer_tests::manual_ctor::test_method(manual_ctor *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<COutPoint> __l_01;
  initializer_list<COutPoint> __l_02;
  initializer_list<COutPoint> __l_03;
  initializer_list<COutPoint> __l_04;
  initializer_list<COutPoint> __l_05;
  initializer_list<transaction_identifier<false>_> __l_06;
  initializer_list<transaction_identifier<false>_> __l_07;
  initializer_list<transaction_identifier<false>_> __l_08;
  initializer_list<transaction_identifier<false>_> __l_09;
  initializer_list<transaction_identifier<false>_> __l_10;
  initializer_list<transaction_identifier<false>_> __l_11;
  initializer_list<transaction_identifier<false>_> __l_12;
  bool bVar5;
  Txid *pTVar6;
  mapped_type_conflict *pmVar7;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffef58;
  lazy_ostream *in_stack_ffffffffffffef60;
  COutPoint *in_stack_ffffffffffffef68;
  MiniMiner *in_stack_ffffffffffffef70;
  undefined4 in_stack_ffffffffffffef78;
  int in_stack_ffffffffffffef7c;
  const_string *in_stack_ffffffffffffef80;
  Txid *in_stack_ffffffffffffef88;
  lazy_ostream *in_stack_ffffffffffffef90;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_ffffffffffffef98;
  unit_test_log_t *this_00;
  undefined7 in_stack_ffffffffffffefa0;
  undefined1 in_stack_ffffffffffffefa7;
  less<transaction_identifier<false>_> *in_stack_ffffffffffffefa8;
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  *in_stack_ffffffffffffefb0;
  size_t in_stack_ffffffffffffefc0;
  undefined7 in_stack_ffffffffffffefc8;
  undefined1 in_stack_ffffffffffffefcf;
  undefined7 in_stack_fffffffffffff090;
  undefined1 in_stack_fffffffffffff097;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
  *in_stack_fffffffffffff098;
  undefined7 in_stack_fffffffffffff0a0;
  undefined1 in_stack_fffffffffffff0a7;
  undefined8 *puVar8;
  CTxMemPool *pool;
  manual_ctor *this_local;
  lazy_ostream local_bd4;
  undefined1 local_bc0 [68];
  lazy_ostream local_b7c;
  undefined1 local_b68 [68];
  lazy_ostream local_b24;
  undefined1 local_b10 [68];
  lazy_ostream local_acc;
  undefined1 local_ab8 [68];
  lazy_ostream local_a74;
  undefined1 local_a60 [68];
  lazy_ostream local_a1c;
  undefined1 local_a08 [68];
  lazy_ostream local_9c4;
  undefined1 local_9b0 [64];
  const_string local_970 [2];
  lazy_ostream local_950 [2];
  assertion_result local_930 [3];
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined4 local_898;
  undefined4 local_894;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> miniminer_info;
  int64_t child_vsize;
  int64_t tx_vsize;
  CTransactionRef child;
  CTransactionRef parent_double_low_feerate;
  CTransactionRef grandparent_low_feerate;
  CTransactionRef parent_med_feerate;
  CTransactionRef grandparent_double_low_feerate;
  CTransactionRef parent_high_feerate;
  CTransactionRef grandparent_zero_fee;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
  sequences;
  MiniMiner miniminer_manual;
  undefined8 local_468 [10];
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  descendant_caches;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffef98,
             (char *)in_stack_ffffffffffffef90,(int)((ulong)in_stack_ffffffffffffef88 >> 0x20),
             (char *)in_stack_ffffffffffffef80,
             (char *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffef68);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffef58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffef98,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffef90,
             (char *)in_stack_ffffffffffffef88,(char *)in_stack_ffffffffffffef80,
             in_stack_ffffffffffffef7c,SUB41((uint)in_stack_ffffffffffffef78 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffef58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffef98,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffef90,
             (char *)in_stack_ffffffffffffef88,(char *)in_stack_ffffffffffffef80,
             in_stack_ffffffffffffef7c,SUB41((uint)in_stack_ffffffffffffef78 >> 0x18,0));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::at((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        *)in_stack_ffffffffffffef68,(size_type)in_stack_ffffffffffffef60);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  COutPoint::COutPoint
            (in_stack_ffffffffffffef68,(Txid *)in_stack_ffffffffffffef60,
             (uint32_t)((ulong)in_stack_ffffffffffffef58 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  __l._M_array._7_1_ = in_stack_ffffffffffffefa7;
  __l._M_array._0_7_ = in_stack_ffffffffffffefa0;
  __l._M_len = (size_type)in_stack_ffffffffffffefa8;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (in_stack_ffffffffffffef98,__l,(allocator_type *)in_stack_ffffffffffffef90);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),in_stack_ffffffffffffefc0);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffef68);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  COutPoint::COutPoint
            (in_stack_ffffffffffffef68,(Txid *)in_stack_ffffffffffffef60,
             (uint32_t)((ulong)in_stack_ffffffffffffef58 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  __l_00._M_array._7_1_ = in_stack_ffffffffffffefa7;
  __l_00._M_array._0_7_ = in_stack_ffffffffffffefa0;
  __l_00._M_len = (size_type)in_stack_ffffffffffffefa8;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (in_stack_ffffffffffffef98,__l_00,(allocator_type *)in_stack_ffffffffffffef90);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),in_stack_ffffffffffffefc0);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffef68);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::at((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        *)in_stack_ffffffffffffef68,(size_type)in_stack_ffffffffffffef60);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  COutPoint::COutPoint
            (in_stack_ffffffffffffef68,(Txid *)in_stack_ffffffffffffef60,
             (uint32_t)((ulong)in_stack_ffffffffffffef58 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  __l_01._M_array._7_1_ = in_stack_ffffffffffffefa7;
  __l_01._M_array._0_7_ = in_stack_ffffffffffffefa0;
  __l_01._M_len = (size_type)in_stack_ffffffffffffefa8;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (in_stack_ffffffffffffef98,__l_01,(allocator_type *)in_stack_ffffffffffffef90);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),in_stack_ffffffffffffefc0);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffef68);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  COutPoint::COutPoint
            (in_stack_ffffffffffffef68,(Txid *)in_stack_ffffffffffffef60,
             (uint32_t)((ulong)in_stack_ffffffffffffef58 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  __l_02._M_array._7_1_ = in_stack_ffffffffffffefa7;
  __l_02._M_array._0_7_ = in_stack_ffffffffffffefa0;
  __l_02._M_len = (size_type)in_stack_ffffffffffffefa8;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (in_stack_ffffffffffffef98,__l_02,(allocator_type *)in_stack_ffffffffffffef90);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),in_stack_ffffffffffffefc0);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffef68);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::at((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        *)in_stack_ffffffffffffef68,(size_type)in_stack_ffffffffffffef60);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  COutPoint::COutPoint
            (in_stack_ffffffffffffef68,(Txid *)in_stack_ffffffffffffef60,
             (uint32_t)((ulong)in_stack_ffffffffffffef58 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  __l_03._M_array._7_1_ = in_stack_ffffffffffffefa7;
  __l_03._M_array._0_7_ = in_stack_ffffffffffffefa0;
  __l_03._M_len = (size_type)in_stack_ffffffffffffefa8;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (in_stack_ffffffffffffef98,__l_03,(allocator_type *)in_stack_ffffffffffffef90);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),in_stack_ffffffffffffefc0);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffef68);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  COutPoint::COutPoint
            (in_stack_ffffffffffffef68,(Txid *)in_stack_ffffffffffffef60,
             (uint32_t)((ulong)in_stack_ffffffffffffef58 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  __l_04._M_array._7_1_ = in_stack_ffffffffffffefa7;
  __l_04._M_array._0_7_ = in_stack_ffffffffffffefa0;
  __l_04._M_len = (size_type)in_stack_ffffffffffffefa8;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (in_stack_ffffffffffffef98,__l_04,(allocator_type *)in_stack_ffffffffffffef90);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),in_stack_ffffffffffffefc0);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffef68);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  COutPoint::COutPoint
            (in_stack_ffffffffffffef68,(Txid *)in_stack_ffffffffffffef60,
             (uint32_t)((ulong)in_stack_ffffffffffffef58 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  COutPoint::COutPoint
            (in_stack_ffffffffffffef68,(Txid *)in_stack_ffffffffffffef60,
             (uint32_t)((ulong)in_stack_ffffffffffffef58 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  COutPoint::COutPoint
            (in_stack_ffffffffffffef68,(Txid *)in_stack_ffffffffffffef60,
             (uint32_t)((ulong)in_stack_ffffffffffffef58 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  __l_05._M_array._7_1_ = in_stack_ffffffffffffefa7;
  __l_05._M_array._0_7_ = in_stack_ffffffffffffefa0;
  __l_05._M_len = (size_type)in_stack_ffffffffffffefa8;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (in_stack_ffffffffffffef98,__l_05,(allocator_type *)in_stack_ffffffffffffef90);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),in_stack_ffffffffffffefc0);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffef68);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffef58);
  std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::vector
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffef58);
  local_894 = 0;
  local_898 = 0;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long_const&,int,int>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffef98,(shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef90,
             (long *)in_stack_ffffffffffffef88,(long *)in_stack_ffffffffffffef80,
             (int *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (int *)in_stack_ffffffffffffef70);
  local_8a0 = 200;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long,long_const&,long_const&>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffef98,(shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef90,
             (long *)in_stack_ffffffffffffef88,(long *)in_stack_ffffffffffffef80,
             (long *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (long *)in_stack_ffffffffffffef70);
  local_8a8 = 1000;
  local_8b0 = 1000;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long_const&,long,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffef98,(shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef90,
             (long *)in_stack_ffffffffffffef88,(long *)in_stack_ffffffffffffef80,
             (long *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (long *)in_stack_ffffffffffffef70);
  local_8b8 = 200;
  local_8c0 = 6000;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long,long_const&,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffef98,(shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef90,
             (long *)in_stack_ffffffffffffef88,(long *)in_stack_ffffffffffffef80,
             (long *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (long *)in_stack_ffffffffffffef70);
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long_const&,long_const&,long_const&>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffef98,(shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef90,
             (long *)in_stack_ffffffffffffef88,(long *)in_stack_ffffffffffffef80,
             (long *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (long *)in_stack_ffffffffffffef70);
  local_8c8 = 200;
  local_8d0 = 1000;
  local_8d8 = 0x5dc;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long,long,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffef98,(shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef90,
             (long *)in_stack_ffffffffffffef88,(long *)in_stack_ffffffffffffef80,
             (long *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (long *)in_stack_ffffffffffffef70);
  local_8e0 = 0x640;
  local_8e8 = 0x1a5e0;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>&,long_const&,long,long_const&,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffef98,(shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef90,
             (long *)in_stack_ffffffffffffef88,(long *)in_stack_ffffffffffffef80,
             (long *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (long *)in_stack_ffffffffffffef70);
  std::
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  ::map((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
         *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_218 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_210 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_208 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_200 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_1f8 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_1f0 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_1e8 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_1e0 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_1d8 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_1d0 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_1c8 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_1c0 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  __l_06._M_len._0_7_ = in_stack_ffffffffffffefc8;
  __l_06._M_array = (iterator)in_stack_ffffffffffffefc0;
  __l_06._M_len._7_1_ = in_stack_ffffffffffffefcf;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set(in_stack_ffffffffffffefb0,__l_06,in_stack_ffffffffffffefa8,
        (allocator_type *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (transaction_identifier<false> *)in_stack_ffffffffffffef70,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffef68);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffef58);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_2a8 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_2a0 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_298 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_290 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_288 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_280 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_278 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_270 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_268 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_260 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_258 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_250 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  __l_07._M_len._0_7_ = in_stack_ffffffffffffefc8;
  __l_07._M_array = (iterator)in_stack_ffffffffffffefc0;
  __l_07._M_len._7_1_ = in_stack_ffffffffffffefcf;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set(in_stack_ffffffffffffefb0,__l_07,in_stack_ffffffffffffefa8,
        (allocator_type *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (transaction_identifier<false> *)in_stack_ffffffffffffef70,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffef68);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffef58);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_338 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_330 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_328 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_320 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_318 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_310 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_308 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_300 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_2f8 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_2f0 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_2e8 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_2e0 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  __l_08._M_len._0_7_ = in_stack_ffffffffffffefc8;
  __l_08._M_array = (iterator)in_stack_ffffffffffffefc0;
  __l_08._M_len._7_1_ = in_stack_ffffffffffffefcf;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set(in_stack_ffffffffffffefb0,__l_08,in_stack_ffffffffffffefa8,
        (allocator_type *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (transaction_identifier<false> *)in_stack_ffffffffffffef70,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffef68);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffef58);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_3a8 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_3a0 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_398 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_390 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_388 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_380 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_378 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_370 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  __l_09._M_len._0_7_ = in_stack_ffffffffffffefc8;
  __l_09._M_array = (iterator)in_stack_ffffffffffffefc0;
  __l_09._M_len._7_1_ = in_stack_ffffffffffffefcf;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set(in_stack_ffffffffffffefb0,__l_09,in_stack_ffffffffffffefa8,
        (allocator_type *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (transaction_identifier<false> *)in_stack_ffffffffffffef70,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffef68);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffef58);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_418 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_410 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_408 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_400 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  local_3f8 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uStack_3f0 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_3e8 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_3e0 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  __l_10._M_len._0_7_ = in_stack_ffffffffffffefc8;
  __l_10._M_array = (iterator)in_stack_ffffffffffffefc0;
  __l_10._M_len._7_1_ = in_stack_ffffffffffffefcf;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set(in_stack_ffffffffffffefb0,__l_10,in_stack_ffffffffffffefa8,
        (allocator_type *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (transaction_identifier<false> *)in_stack_ffffffffffffef70,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffef68);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffef58);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  puVar8 = local_468;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  pTVar6 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  uVar2 = *(undefined8 *)(pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar3 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  puVar8[2] = *(undefined8 *)((pTVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  puVar8[3] = uVar4;
  *puVar8 = uVar2;
  puVar8[1] = uVar3;
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  __l_11._M_len._0_7_ = in_stack_ffffffffffffefc8;
  __l_11._M_array = (iterator)in_stack_ffffffffffffefc0;
  __l_11._M_len._7_1_ = in_stack_ffffffffffffefcf;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set(in_stack_ffffffffffffefb0,__l_11,in_stack_ffffffffffffefa8,
        (allocator_type *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (transaction_identifier<false> *)in_stack_ffffffffffffef70,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffef68);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffef58);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef58);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  __l_12._M_len._0_7_ = in_stack_ffffffffffffefc8;
  __l_12._M_array = (iterator)in_stack_ffffffffffffefc0;
  __l_12._M_len._7_1_ = in_stack_ffffffffffffefcf;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set(in_stack_ffffffffffffefb0,__l_12,in_stack_ffffffffffffefa8,
        (allocator_type *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
             (transaction_identifier<false> *)in_stack_ffffffffffffef70,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffef68);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffef58);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffef58);
  ::node::MiniMiner::MiniMiner
            ((MiniMiner *)CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
             in_stack_fffffffffffff098,
             (map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98,
               (const_string *)in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88,
               in_stack_ffffffffffffef80);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffef58);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68,
               SUB81((ulong)in_stack_ffffffffffffef60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffef60,(basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    in_stack_ffffffffffffef58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_930,local_950,local_970,0x2b4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef58);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  ::node::MiniMiner::Linearize(in_stack_ffffffffffffef70);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98,
               (const_string *)in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88,
               in_stack_ffffffffffffef80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffef60,(char (*) [1])in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffef58);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
    pmVar7 = std::
             map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
             ::at((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                   *)in_stack_ffffffffffffef80,
                  (key_type *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
    local_9c4._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffef68 = (COutPoint *)0x1d1f9c0;
    in_stack_ffffffffffffef60 = &local_9c4;
    in_stack_ffffffffffffef58 = "sequences.at(grandparent_zero_fee->GetHash())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_9b0,(undefined1 *)((long)&local_9c4._vptr_lazy_ostream + 4),0x2b8,1,2,pmVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef58);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98,
               (const_string *)in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88,
               in_stack_ffffffffffffef80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffef60,(char (*) [1])in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffef58);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
    pmVar7 = std::
             map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
             ::at((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                   *)in_stack_ffffffffffffef80,
                  (key_type *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
    local_a1c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffef68 = (COutPoint *)0x1d1f9c0;
    in_stack_ffffffffffffef60 = &local_a1c;
    in_stack_ffffffffffffef58 = "sequences.at(parent_high_feerate->GetHash())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_a08,(undefined1 *)((long)&local_a1c._vptr_lazy_ostream + 4),0x2b9,1,2,pmVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef58);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98,
               (const_string *)in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88,
               in_stack_ffffffffffffef80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffef60,(char (*) [1])in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffef58);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
    pmVar7 = std::
             map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
             ::at((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                   *)in_stack_ffffffffffffef80,
                  (key_type *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
    local_a74._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffef68 = (COutPoint *)0x1ccb7e1;
    in_stack_ffffffffffffef60 = &local_a74;
    in_stack_ffffffffffffef58 = "sequences.at(grandparent_double_low_feerate->GetHash())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_a60,(undefined1 *)((long)&local_a74._vptr_lazy_ostream + 4),700,1,2,pmVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef58);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98,
               (const_string *)in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88,
               in_stack_ffffffffffffef80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffef60,(char (*) [1])in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffef58);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
    pmVar7 = std::
             map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
             ::at((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                   *)in_stack_ffffffffffffef80,
                  (key_type *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
    local_acc._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffef68 = (COutPoint *)0x1ccb7e1;
    in_stack_ffffffffffffef60 = &local_acc;
    in_stack_ffffffffffffef58 = "sequences.at(parent_med_feerate->GetHash())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_ab8,(undefined1 *)((long)&local_acc._vptr_lazy_ostream + 4),0x2bd,1,2,pmVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef58);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98,
               (const_string *)in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88,
               in_stack_ffffffffffffef80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffef60,(char (*) [1])in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffef58);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
    pmVar7 = std::
             map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
             ::at((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                   *)in_stack_ffffffffffffef80,
                  (key_type *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
    local_b24._vptr_lazy_ostream._0_4_ = 2;
    in_stack_ffffffffffffef68 = (COutPoint *)0x1bc65e2;
    in_stack_ffffffffffffef60 = &local_b24;
    in_stack_ffffffffffffef58 = "sequences.at(grandparent_low_feerate->GetHash())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_b10,(undefined1 *)((long)&local_b24._vptr_lazy_ostream + 4),0x2c0,1,2,pmVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef58);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98,
               (const_string *)in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88,
               in_stack_ffffffffffffef80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffef60,(char (*) [1])in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffef58);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
    pmVar7 = std::
             map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
             ::at((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                   *)in_stack_ffffffffffffef80,
                  (key_type *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
    local_b7c._vptr_lazy_ostream._0_4_ = 2;
    in_stack_ffffffffffffef68 = (COutPoint *)0x1bc65e2;
    in_stack_ffffffffffffef60 = &local_b7c;
    in_stack_ffffffffffffef58 = "sequences.at(parent_double_low_feerate->GetHash())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_b68,(undefined1 *)((long)&local_b7c._vptr_lazy_ostream + 4),0x2c1,1,2,pmVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef58);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88,
               in_stack_ffffffffffffef80);
    in_stack_ffffffffffffef90 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffef60,(char (*) [1])in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffef58);
    in_stack_ffffffffffffef88 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef58);
    in_stack_ffffffffffffef80 =
         (const_string *)
         std::
         map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
         ::at((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
               *)in_stack_ffffffffffffef80,
              (key_type *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
    local_bd4._vptr_lazy_ostream._0_4_ = 3;
    in_stack_ffffffffffffef68 = (COutPoint *)0x1bc001a;
    in_stack_ffffffffffffef60 = &local_bd4;
    in_stack_ffffffffffffef58 = "sequences.at(child->GetHash())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_bc0,(undefined1 *)((long)&local_bd4._vptr_lazy_ostream + 4),0x2c4,1,2,
               in_stack_ffffffffffffef80);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef58);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_ffffffffffffef7c = CONCAT13(bVar5,(int3)in_stack_ffffffffffffef7c);
  } while (bVar5);
  std::
  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
  ::~map((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
          *)in_stack_ffffffffffffef58);
  ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffef58);
  std::
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  ::~map((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
          *)in_stack_ffffffffffffef58);
  std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::~vector
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffef68);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef58);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef58);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef58);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef58);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef58);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef58);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffef58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffef58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(manual_ctor, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(cs_main, pool.cs);
    {
        // 3 pairs of grandparent + fee-bumping parent, plus 1 low-feerate child.
        // 0 fee + high fee
        auto grandparent_zero_fee = make_tx({{m_coinbase_txns.at(0)->GetHash(), 0}}, 1);
        auto parent_high_feerate = make_tx({{grandparent_zero_fee->GetHash(), 0}}, 1);
        // double low fee + med fee
        auto grandparent_double_low_feerate = make_tx({{m_coinbase_txns.at(2)->GetHash(), 0}}, 1);
        auto parent_med_feerate = make_tx({{grandparent_double_low_feerate->GetHash(), 0}}, 1);
        // low fee + double low fee
        auto grandparent_low_feerate = make_tx({{m_coinbase_txns.at(1)->GetHash(), 0}}, 1);
        auto parent_double_low_feerate = make_tx({{grandparent_low_feerate->GetHash(), 0}}, 1);
        // child is below the cpfp package feerates because it is larger than everything else
        auto child = make_tx({{parent_high_feerate->GetHash(), 0}, {parent_double_low_feerate->GetHash(), 0}, {parent_med_feerate->GetHash(), 0}}, 1);

        // We artificially record each transaction (except the child) with a uniform vsize of 100vB.
        const int64_t tx_vsize{100};
        const int64_t child_vsize{1000};

        std::vector<node::MiniMinerMempoolEntry> miniminer_info;
        miniminer_info.emplace_back(grandparent_zero_fee,          /*vsize_self=*/tx_vsize,/*vsize_ancestor=*/tx_vsize, /*fee_self=*/0,/*fee_ancestor=*/0);
        miniminer_info.emplace_back(parent_high_feerate,                          tx_vsize,                 2*tx_vsize, high_fee,      high_fee);
        miniminer_info.emplace_back(grandparent_double_low_feerate,               tx_vsize,                   tx_vsize, 2*low_fee,     2*low_fee);
        miniminer_info.emplace_back(parent_med_feerate,                           tx_vsize,                 2*tx_vsize, med_fee,       2*low_fee+med_fee);
        miniminer_info.emplace_back(grandparent_low_feerate,                      tx_vsize,                   tx_vsize, low_fee,       low_fee);
        miniminer_info.emplace_back(parent_double_low_feerate,                    tx_vsize,                 2*tx_vsize, 2*low_fee,     3*low_fee);
        miniminer_info.emplace_back(child,                                     child_vsize,     6*tx_vsize+child_vsize, low_fee,       high_fee+med_fee+6*low_fee);
        std::map<Txid, std::set<Txid>> descendant_caches;
        descendant_caches.emplace(grandparent_zero_fee->GetHash(), std::set<Txid>{grandparent_zero_fee->GetHash(), parent_high_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(grandparent_low_feerate->GetHash(), std::set<Txid>{grandparent_low_feerate->GetHash(), parent_double_low_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(grandparent_double_low_feerate->GetHash(), std::set<Txid>{grandparent_double_low_feerate->GetHash(), parent_med_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(parent_high_feerate->GetHash(), std::set<Txid>{parent_high_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(parent_med_feerate->GetHash(), std::set<Txid>{parent_med_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(parent_double_low_feerate->GetHash(), std::set<Txid>{parent_double_low_feerate->GetHash(), child->GetHash()});
        descendant_caches.emplace(child->GetHash(), std::set<Txid>{child->GetHash()});

        node::MiniMiner miniminer_manual(miniminer_info, descendant_caches);
        BOOST_CHECK(miniminer_manual.IsReadyToCalculate());
        const auto sequences{miniminer_manual.Linearize()};

        // CPFP zero + high
        BOOST_CHECK_EQUAL(sequences.at(grandparent_zero_fee->GetHash()), 0);
        BOOST_CHECK_EQUAL(sequences.at(parent_high_feerate->GetHash()), 0);

        // CPFP double low + med
        BOOST_CHECK_EQUAL(sequences.at(grandparent_double_low_feerate->GetHash()), 1);
        BOOST_CHECK_EQUAL(sequences.at(parent_med_feerate->GetHash()), 1);

        // CPFP low + double low
        BOOST_CHECK_EQUAL(sequences.at(grandparent_low_feerate->GetHash()), 2);
        BOOST_CHECK_EQUAL(sequences.at(parent_double_low_feerate->GetHash()), 2);

        // Child at the end
        BOOST_CHECK_EQUAL(sequences.at(child->GetHash()), 3);
    }
}